

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesschan.c
# Opt level: O0

size_t sftp_chan_send(Channel *chan,_Bool is_stderr,void *data,size_t length)

{
  size_t sVar1;
  sftp_packet *pkt_00;
  sftp_packet *pkt_01;
  sftp_packet *reply;
  sftp_packet *pkt;
  uint pktlen;
  char lenbuf [4];
  sesschan *sess;
  size_t length_local;
  void *data_local;
  _Bool is_stderr_local;
  Channel *chan_local;
  
  _pktlen = &chan[-0x5e].initial_fixed_window_size;
  bufchain_add((bufchain *)(chan + -4),data,length);
  while( true ) {
    sVar1 = bufchain_size((bufchain *)(_pktlen + 0x166));
    if (sVar1 < 4) {
      return 0;
    }
    bufchain_fetch((bufchain *)(_pktlen + 0x166),(void *)((long)&pkt + 4),4);
    pkt._0_4_ = GET_32BIT_MSB_FIRST((void *)((long)&pkt + 4));
    sVar1 = bufchain_size((bufchain *)(_pktlen + 0x166));
    if (sVar1 - 4 < (ulong)(uint32_t)pkt) break;
    bufchain_consume((bufchain *)(_pktlen + 0x166),4);
    pkt_00 = sftp_recv_prepare((uint32_t)pkt);
    bufchain_fetch_consume((bufchain *)(_pktlen + 0x166),pkt_00->data,(ulong)(uint32_t)pkt);
    sftp_recv_finish(pkt_00);
    pkt_01 = sftp_handle_request(*(SftpServer **)(_pktlen + 0x170),pkt_00);
    sftp_pkt_free(pkt_00);
    sftp_send_prepare(pkt_01);
    sshfwd_write(*(SshChannel **)_pktlen,pkt_01->data,pkt_01->length);
    sftp_pkt_free(pkt_01);
  }
  return 0;
}

Assistant:

static size_t sftp_chan_send(Channel *chan, bool is_stderr,
                             const void *data, size_t length)
{
    sesschan *sess = container_of(chan, sesschan, chan);

    bufchain_add(&sess->subsys_input, data, length);

    while (bufchain_size(&sess->subsys_input) >= 4) {
        char lenbuf[4];
        unsigned pktlen;
        struct sftp_packet *pkt, *reply;

        bufchain_fetch(&sess->subsys_input, lenbuf, 4);
        pktlen = GET_32BIT_MSB_FIRST(lenbuf);

        if (bufchain_size(&sess->subsys_input) - 4 < pktlen)
            break;                     /* wait for more data */

        bufchain_consume(&sess->subsys_input, 4);
        pkt = sftp_recv_prepare(pktlen);
        bufchain_fetch_consume(&sess->subsys_input, pkt->data, pktlen);
        sftp_recv_finish(pkt);
        reply = sftp_handle_request(sess->sftpsrv, pkt);
        sftp_pkt_free(pkt);

        sftp_send_prepare(reply);
        sshfwd_write(sess->c, reply->data, reply->length);
        sftp_pkt_free(reply);
    }

    return 0;
}